

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O3

const_buffer * __thiscall
cppcms::impl::cgi::http::make_chunked_wrapper
          (const_buffer *__return_storage_ptr__,http *this,const_buffer *in,bool completed)

{
  vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  *this_00;
  undefined4 uVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  const_buffer tmp_1;
  const_buffer tmp_2;
  const_buffer tmp;
  ostringstream ss;
  buffer_impl<const_char_*> local_238;
  buffer_impl<const_char_*> local_208;
  buffer_impl<const_char_*> local_1d8;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  sVar2 = booster::aio::buffer_impl<const_char_*>::bytes_count(&in->super_buffer_impl<const_char_*>)
  ;
  if (sVar2 == 0) {
    this_00 = &(__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_;
    if (completed) {
      (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = 0;
      (this_00->
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      booster::aio::buffer_impl<const_char_*>::add
                (&__return_storage_ptr__->super_buffer_impl<const_char_*>,"0\r\n\r\n",5);
    }
    else {
      (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.size =
           (in->super_buffer_impl<const_char_*>).entry_.size;
      uVar1 = *(undefined4 *)&(in->super_buffer_impl<const_char_*>).field_0x4;
      pcVar4 = (in->super_buffer_impl<const_char_*>).entry_.ptr;
      (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ =
           (in->super_buffer_impl<const_char_*>).size_;
      *(undefined4 *)&(__return_storage_ptr__->super_buffer_impl<const_char_*>).field_0x4 = uVar1;
      (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.ptr = pcVar4;
      std::
      vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ::vector(this_00,&(in->super_buffer_impl<const_char_*>).vec_);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    booster::aio::buffer_impl<const_char_*>::bytes_count(&in->super_buffer_impl<const_char_*>);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    pcVar4 = "\r\n";
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->chunked_header_,(string *)&local_238);
    if ((size_t *)local_238._0_8_ != (size_t *)((long)&local_238 + 0x10U)) {
      operator_delete((void *)local_238._0_8_);
    }
    if (completed) {
      pcVar4 = "\r\n0\r\n\r\n";
    }
    local_1d8.size_ = 0;
    local_1d8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<const_char_*>::add
              (&local_1d8,(this->chunked_header_)._M_dataplus._M_p,
               (this->chunked_header_)._M_string_length);
    local_238.entry_.size = local_1d8.entry_.size;
    local_238._4_4_ = local_1d8._4_4_;
    local_238.size_ = local_1d8.size_;
    local_238.entry_.ptr = local_1d8.entry_.ptr;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::vector((vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              *)((long)&local_238 + 0x18U),&local_1d8.vec_);
    booster::aio::details::add<booster::aio::const_buffer>((const_buffer *)&local_238,in);
    local_208.size_ = 0;
    local_208.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<const_char_*>::add(&local_208,pcVar4,(ulong)completed * 5 + 2);
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.size = local_238.entry_.size;
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = local_238.size_;
    *(undefined4 *)&(__return_storage_ptr__->super_buffer_impl<const_char_*>).field_0x4 =
         local_238._4_4_;
    (__return_storage_ptr__->super_buffer_impl<const_char_*>).entry_.ptr = local_238.entry_.ptr;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::vector(&(__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_,
             (vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              *)((long)&local_238 + 0x18U));
    booster::aio::details::add<booster::aio::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_208);
    if (local_208.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_238.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1d8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

booster::aio::const_buffer make_chunked_wrapper(booster::aio::const_buffer const &in,bool completed)
		{
			if(in.bytes_count() == 0) {
				if(!completed) 
					return in;
				else 
					return booster::aio::buffer("0\r\n\r\n",5);
			}

			std::ostringstream ss;
			ss << std::hex << in.bytes_count() << "\r\n";
			chunked_header_ = std::move(ss.str());
			char const *trailer = "\r\n";
			int trailer_len = 2;
			if(completed) {
				trailer = "\r\n0\r\n\r\n";
				trailer_len = 7;
			}
			return booster::aio::buffer(chunked_header_) + in + booster::aio::buffer(trailer,trailer_len);
		}